

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

int main(void)

{
  Header *header;
  MCU *mcus;
  ostream *poVar1;
  long lVar2;
  int iVar3;
  string outFileName;
  string filename;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,
             "/workspace/llm4binary/github/license_c_cmakelists/Cheemion[P]JPEG_COMPRESS/resource/lina.jpg"
             ,(allocator<char> *)&outFileName);
  std::__cxx11::string::string((string *)&local_38,(string *)&filename);
  header = readJPG(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  iVar3 = -1;
  if (header != (Header *)0x0) {
    if (header->valid == false) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Error");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&(header->huffmanData).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      operator_delete(header,0x1e70);
    }
    else {
      printHeader(header);
      mcus = decodeHuffmanData(header);
      if (mcus == (MCU *)0x0) {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&(header->huffmanData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        operator_delete(header,0x1e70);
      }
      else {
        dequantize(header,mcus);
        inverseDCT(header,mcus);
        YCbCrToRGB(header,mcus);
        poVar1 = std::operator<<((ostream *)&std::cout,"done");
        std::endl<char,std::char_traits<char>>(poVar1);
        lVar2 = std::__cxx11::string::rfind((char)&filename,0x2e);
        if (lVar2 == -1) {
          std::operator+(&outFileName,&filename,".");
        }
        else {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)&filename);
          std::operator+(&outFileName,&local_58,".bmp");
          std::__cxx11::string::~string((string *)&local_58);
        }
        std::__cxx11::string::string((string *)&local_78,(string *)&outFileName);
        writeBMP(header,mcus,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        operator_delete__(mcus);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&(header->huffmanData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        operator_delete(header,0x1e70);
        std::__cxx11::string::~string((string *)&outFileName);
      }
      iVar3 = 0;
    }
  }
  std::__cxx11::string::~string((string *)&filename);
  return iVar3;
}

Assistant:

int main() {
	
	//jpeg file path
	const std::string filename(EXAMPLE_PATH_JPG);

	Header* header = readJPG(filename);
	if (header == nullptr) {
		return -1;
	}

	if (header->valid == false) {
		std::cout << "Error" << std::endl;
		delete header;
		return -1;
	}

	printHeader(header);


	//decode huffman data
	MCU* mcus = decodeHuffmanData(header);
	//write BMP file
	if (mcus == nullptr)
	{	
		delete header;
		return 0;
	}

	dequantize(header, mcus);

	inverseDCT(header, mcus);

	YCbCrToRGB(header, mcus);

	std::cout << "done" << std::endl;
	// write BMP file
	const std::size_t pos = filename.find_last_of('.');
	const std::string outFileName = (pos == std::string::npos) ? (filename + ".") : (filename.substr(0, pos) + ".bmp");
	writeBMP(header, mcus, outFileName);
	delete[] mcus;
	delete header;

	return 0;
}